

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  Type *pTVar5;
  HeapType HVar6;
  uintptr_t *puVar7;
  Nullability NVar8;
  Type local_78;
  Type local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Iterator __begin2;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  cVar1 = wasm::Type::isTuple();
  if (cVar1 == '\0') {
    cVar1 = wasm::Type::isRef();
    if (cVar1 == '\0') {
      local_70.id = local_38.id;
      if (6 < local_38.id) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xdbf,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
      }
    }
    else {
      HVar6.id = wasm::Type::getHeapType();
      HVar6 = getSubType(this,HVar6);
      iVar3 = wasm::Type::getNullability();
      NVar8 = NonNullable;
      if ((iVar3 != 0) &&
         ((((byte)this->wasm[0x109] & 4) == 0 ||
          (uVar4 = Random::upTo(&this->random,2), NVar8 = NonNullable, uVar4 != 0)))) {
        NVar8 = Nullable;
      }
      wasm::Type::Type((Type *)auStack_68,HVar6,NVar8);
      bVar2 = isUninhabitable((Type)auStack_68);
      if (((!bVar2) || (bVar2 = isUninhabitable(local_38), bVar2)) ||
         (uVar4 = Random::upTo(&this->random,0x14), pTVar5 = &local_38, uVar4 == 0)) {
        pTVar5 = (Type *)auStack_68;
      }
      local_70.id = pTVar5->id;
    }
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &local_38;
    pTVar5 = (Type *)wasm::Type::size();
    if (pTVar5 == (Type *)0x0) goto LAB_001239c0;
    do {
      do {
        puVar7 = (uintptr_t *)
                 wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_78 = getSubType(this,*puVar7);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_78);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)local_78;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar5);
LAB_001239c0:
    } while (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != &local_38);
    Tuple::Tuple((Tuple *)&types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(TypeList *)auStack_68);
    wasm::Type::Type(&local_70,
                     (Tuple *)&types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index - (long)types.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
  }
  return (Type)local_70.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = getSubType(type.getHeapType());
    auto nullability = getSubType(type.getNullability());
    auto subType = Type(heapType, nullability);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (isUninhabitable(subType) && !isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}